

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *Globals,stringstream *ReturnHandlerSS,String *Prologue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StorageQualifier SVar2;
  InOutPatchType IVar3;
  bool bVar4;
  ShaderParameterInfo *pSVar5;
  pointer pSVar6;
  HLSL2GLSLConverterImpl *pHVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ConversionStream *this_00;
  int iVar11;
  __node_base_ptr p_Var12;
  ostream *poVar13;
  size_t sVar14;
  pointer pSVar15;
  undefined8 *puVar16;
  long *plVar17;
  ConversionStream *this_01;
  _Hash_node_base *p_Var18;
  pointer pSVar19;
  int location;
  ShaderParameterInfo **ppSVar20;
  undefined8 uVar21;
  char *Prefix;
  char *pcVar22;
  stringstream *psVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  long lVar25;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  String GLSLVariable;
  String VarName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> InputVarName;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  iterator Token;
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Attributes;
  stringstream PrologueSS;
  stringstream InterfaceVarsOutSS;
  stringstream InterfaceVarsInSS;
  stringstream GlobalsSS;
  undefined1 local_7a8 [32];
  String local_788;
  char *local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_760;
  String local_748;
  String local_728;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  local_708;
  void *local_6e8;
  iterator iStack_6e0;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_6d8;
  ConversionStream *local_6d0;
  int local_6c8;
  int local_6c4;
  char *local_6c0;
  String *local_6b8;
  String *local_6b0;
  stringstream *local_6a8;
  char *local_6a0;
  pointer local_698;
  iterator local_690;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_688;
  undefined1 local_650 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640 [7];
  ios_base aiStack_5d0 [264];
  stringstream local_4c8 [128];
  ios_base aiStack_448 [264];
  stringstream local_340 [128];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_690 = (iterator)TypeToken->_M_node;
  local_688._M_buckets = &local_688._M_single_bucket;
  local_688._M_bucket_count = 1;
  local_688._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_688._M_element_count = 0;
  local_688._M_rehash_policy._M_max_load_factor = 1.0;
  local_688._M_rehash_policy._M_next_resize = 0;
  local_688._M_single_bucket = (__node_base_ptr)0x0;
  ParseAttributesInComment
            ((String *)&local_690._M_node[3]._M_prev,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_688);
  ProcessShaderAttributes
            (this,&local_690,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_688);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_650._0_8_ = "domain";
  local_650._8_8_ = 0xcaaeccf1c670984;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_688._M_bucket_count;
  p_Var12 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_688,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xcaaeccf1c670984)) % auVar8,0),
                       (key_type *)local_650,0xcaaeccf1c670984);
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var18 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var18 = p_Var12->_M_nxt;
  }
  local_6b8 = Globals;
  if (((char *)local_650._0_8_ != (char *)0x0) && ((long)local_650._8_8_ < 0)) {
    operator_delete__((void *)local_650._0_8_);
  }
  if (p_Var18 == (_Hash_node_base *)0x0) {
    LogError<true,char[40]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf15,(char (*) [40])"Domain shader misses \"domain\" attribute");
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"layout(",7);
  pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var18 + 3);
  iVar11 = std::__cxx11::string::compare((char *)pbVar24);
  if (iVar11 == 0) {
    lVar25 = 9;
    pcVar22 = "triangles";
LAB_002012b8:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar22,lVar25);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 5;
      pcVar22 = "quads";
      goto LAB_002012b8;
    }
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 8;
      pcVar22 = "isolines";
      goto LAB_002012b8;
    }
    LogError<true,char[26],std::__cxx11::string,char[55]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf1f,(char (*) [26])"Unexpected domain value \"",pbVar24,
               (char (*) [55])"\". String constant \"tri\", \"quad\" or \"isoline\" expected");
  }
  local_650._0_8_ = "partitioning";
  local_650._8_8_ = 0x2779e7fde7b9e178;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_688._M_bucket_count;
  p_Var12 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_688,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2779e7fde7b9e178)) % auVar9,0),
                       (key_type *)local_650,0x2779e7fde7b9e178);
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var18 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var18 = p_Var12->_M_nxt;
  }
  local_6d0 = this;
  local_6b0 = Prologue;
  if (((char *)local_650._0_8_ != (char *)0x0) && ((long)local_650._8_8_ < 0)) {
    operator_delete__((void *)local_650._0_8_);
  }
  if (p_Var18 == (_Hash_node_base *)0x0) {
    LogError<true,char[395]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf25,(char (*) [395])
                      "Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var18 + 3);
  iVar11 = std::__cxx11::string::compare((char *)pbVar24);
  lVar25 = 0xf;
  pcVar22 = ", equal_spacing";
  if (iVar11 == 0) {
LAB_0020146b:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar22,lVar25);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 0x19;
      pcVar22 = ", fractional_even_spacing";
      goto LAB_0020146b;
    }
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 0x18;
      pcVar22 = ", fractional_odd_spacing";
      goto LAB_0020146b;
    }
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      FormatString<char[73]>
                ((string *)local_650,
                 (char (*) [73])
                 "pow2 partitioning is not supported by OpenGL. Using integer partitioning");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_650._0_8_,0,0,0);
      }
      if ((undefined1 *)local_650._0_8_ != local_650 + 0x10) {
        operator_delete((void *)local_650._0_8_,local_640[0]._M_allocated_capacity + 1);
      }
      goto LAB_0020146b;
    }
    LogError<true,char[26],std::__cxx11::string,char[86]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf33,(char (*) [26])"Unexpected partitioning \"",pbVar24,
               (char (*) [86])
               "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected"
              );
  }
  local_650._0_8_ = "outputtopology";
  local_650._8_8_ = 0x507bd7cd66e764d0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_688._M_bucket_count;
  p_Var12 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_688,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x507bd7cd66e764d0)) % auVar10,0),
                       (key_type *)local_650,0x507bd7cd66e764d0);
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var18 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var18 = p_Var12->_M_nxt;
  }
  if (((char *)local_650._0_8_ != (char *)0x0) && ((long)local_650._8_8_ < 0)) {
    operator_delete__((void *)local_650._0_8_);
  }
  if (p_Var18 == (_Hash_node_base *)0x0) {
    LogError<true,char[399]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf39,(char (*) [399])
                      "Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var18 + 3);
  iVar11 = std::__cxx11::string::compare((char *)pbVar24);
  pcVar22 = "";
  if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)pbVar24), iVar11 == 0)) {
    lVar25 = 0;
LAB_0020159a:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar22,lVar25);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 4;
      pcVar22 = ", cw";
      goto LAB_0020159a;
    }
    iVar11 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar11 == 0) {
      lVar25 = 5;
      pcVar22 = ", ccw";
      goto LAB_0020159a;
    }
    LogError<true,char[22],std::__cxx11::string,char[78]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf44,(char (*) [22])"Unexpected topology \"",pbVar24,
               (char (*) [78])
               "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected"
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")in;\n",5);
  std::__cxx11::stringstream::stringstream((stringstream *)local_650);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_4c8);
  pSVar19 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_698 = (Params->
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar19 != local_698) {
    psVar23 = ReturnHandlerSS + 0x10;
    local_6c8 = 0;
    local_6c4 = 0;
    local_6a8 = psVar23;
    do {
      SVar2 = pSVar19->storageQualifier;
      if ((SVar2 == Ret) || (SVar2 == Out)) {
        local_788._M_dataplus._M_p = (pointer)0x0;
        local_788._M_string_length = 0;
        local_788.field_2._0_8_ = (ShaderParameterInfo **)0x0;
        aStack_760._8_8_ =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_768 = (char *)0x0;
        aStack_760._M_allocated_capacity = 0;
        local_7a8._0_8_ = pSVar19;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_788,(iterator)0x0,(ShaderParameterInfo **)local_7a8);
        local_7a8._0_8_ =
             (pSVar19->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (aStack_760._M_allocated_capacity == aStack_760._8_8_) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_768,(iterator)aStack_760._M_allocated_capacity,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7a8);
        }
        else {
          *(undefined8 *)aStack_760._M_allocated_capacity = local_7a8._0_8_;
          aStack_760._M_allocated_capacity = aStack_760._M_allocated_capacity + 8;
        }
        if (((pSVar19->storageQualifier != Ret) && ((pSVar19->GSAttribs).PrimType == Undefined)) &&
           ((pSVar19->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_650 + 0x10),"    ",4)
          ;
          pcVar22 = (pSVar19->Type)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)local_650 + 0x10 +
                            (int)*(undefined8 *)(local_640[0]._M_allocated_capacity - 0x18));
          }
          else {
            sVar14 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_650 + 0x10),pcVar22,sVar14);
          }
          local_7a8[0] = (string)0x20;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_650 + 0x10),(char *)local_7a8,1);
          pcVar22 = (pSVar19->Name)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar22,sVar14);
          }
          if ((pSVar19->ArraySize)._M_string_length != 0) {
            local_7a8[0] = (string)0x5b;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_650 + 0x10),(char *)local_7a8,1);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(pSVar19->ArraySize)._M_dataplus._M_p,
                                 (pSVar19->ArraySize)._M_string_length);
            local_7a8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_7a8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_650 + 0x10),";\n",2);
        }
        while( true ) {
          if (local_788._M_dataplus._M_p == (pointer)local_788._M_string_length) break;
          pSVar5 = *(ShaderParameterInfo **)(local_788._M_string_length + -8);
          pSVar6 = (pSVar5->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = (pSVar5->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar6 == pSVar15) {
            if (((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)(aStack_760._M_allocated_capacity - 8))->_M_current != pSVar6) {
              FormatString<char[26],char[49]>
                        ((string *)local_7a8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])pSVar6);
              DebugAssertionFailed
                        ((Char *)local_7a8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
                operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
              }
            }
            if ((pSVar5->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar5->Name,
                         (char (*) [2])0x358930);
            }
            local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
            local_728._M_string_length = 0;
            local_728.field_2._M_local_buf[0] = '\0';
            pHVar7 = local_6d0->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_7a8,(pSVar5->Semantic)._M_dataplus._M_p,false);
            this_01 = (ConversionStream *)
                      ((local_7a8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[4]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var12 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[4]._M_elems[1]._M_h,
                                 (size_type)this_01,(key_type *)local_7a8,
                                 local_7a8._8_8_ & 0x7fffffffffffffff);
            if (p_Var12 == (__node_base_ptr)0x0) {
              p_Var18 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var18 = p_Var12->_M_nxt;
            }
            if (((pointer)local_7a8._0_8_ != (pointer)0x0) && ((long)local_7a8._8_8_ < 0)) {
              operator_delete__((void *)local_7a8._0_8_);
            }
            if (p_Var18 != (_Hash_node_base *)0x0) {
              this_01 = (ConversionStream *)(p_Var18 + 3);
              std::__cxx11::string::_M_assign((string *)&local_728);
            }
            pcVar22 = "";
            if (pSVar5->storageQualifier == Ret) {
              pcVar22 = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_
                      ((string *)local_7a8,this_01,
                       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                        *)&local_788,'.',"",pcVar22,"");
            this_00 = local_6d0;
            if (local_728._M_string_length == 0) {
              pcVar22 = "_";
              if (local_6d0->m_bUseInOutLocationQualifiers != false) {
                pcVar22 = "_dsout_";
              }
              BuildParameterName_abi_cxx11_
                        (&local_748,this_01,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)&local_788,'_',pcVar22,"","");
              bVar4 = this_00->m_bUseInOutLocationQualifiers;
              pcVar22 = GetInterpolationQualifier(this_00,pSVar5);
              iVar11 = local_6c4;
              location = -1;
              if (bVar4 != false) {
                location = local_6c4;
              }
              DefineInterfaceVar(location,pcVar22,"out",&pSVar5->Type,&local_748,
                                 (stringstream *)local_4c8);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)psVar23,local_748._M_dataplus._M_p,
                                   local_748._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," = ",3);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)local_7a8._0_8_,local_7a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\\\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p,local_748.field_2._0_8_ + 1);
              }
              local_6c4 = iVar11 + (uint)bVar4;
            }
            else {
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)psVar23,local_728._M_dataplus._M_p,
                                   local_728._M_string_length);
              local_748._M_dataplus._M_p._0_1_ = 0x28;
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)&local_748,1);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)local_7a8._0_8_,local_7a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,");\\\n",4);
            }
            if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
              operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
            }
            local_788._M_string_length = local_788._M_string_length + -8;
            aStack_760._M_allocated_capacity = aStack_760._M_allocated_capacity - 8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_728._M_dataplus._M_p != &local_728.field_2) {
              operator_delete(local_728._M_dataplus._M_p,
                              CONCAT71(local_728.field_2._1_7_,local_728.field_2._M_local_buf[0]) +
                              1);
            }
          }
          else {
            if ((pSVar5->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name,
                         (char (*) [2])0x358930);
              pSVar15 = (pSVar5->members).
                        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pSVar6 = ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                       *)(aStack_760._M_allocated_capacity - 8))->_M_current;
            if (pSVar6 == pSVar15) {
              local_788._M_string_length = local_788._M_string_length + -8;
              aStack_760._M_allocated_capacity =
                   (size_type)
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)(aStack_760._M_allocated_capacity - 8);
            }
            else {
              ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                *)(aStack_760._M_allocated_capacity - 8))->_M_current = pSVar6 + 1;
              if (local_788._M_string_length == local_788.field_2._0_8_) {
                local_7a8._0_8_ = pSVar6;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_788,(iterator)local_788._M_string_length,
                           (ShaderParameterInfo **)local_7a8);
              }
              else {
                *(pointer *)local_788._M_string_length = pSVar6;
                local_788._M_string_length = local_788._M_string_length + 8;
              }
              local_7a8._0_8_ =
                   (pSVar6->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (aStack_760._M_allocated_capacity == aStack_760._8_8_) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_768,(iterator)aStack_760._M_allocated_capacity,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_7a8);
              }
              else {
                *(undefined8 *)aStack_760._M_allocated_capacity = local_7a8._0_8_;
                aStack_760._M_allocated_capacity =
                     (size_type)
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)(aStack_760._M_allocated_capacity + 8);
              }
            }
          }
        }
        if (local_768 != (char *)0x0) {
          operator_delete(local_768,aStack_760._8_8_ - (long)local_768);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_788._M_dataplus._M_p,
                          local_788.field_2._0_8_ - (long)local_788._M_dataplus._M_p);
        }
      }
      else if (SVar2 == In) {
        IVar3 = (pSVar19->HSAttribs).PatchType;
        if (IVar3 == OutputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_650 + 0x10),"    const int _NumInputPoints = ",0x20);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_650 + 0x10),(pSVar19->ArraySize)._M_dataplus._M_p,
                               (pSVar19->ArraySize)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_650 + 0x10),"    ",4)
          ;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_650 + 0x10),(pSVar19->Type)._M_dataplus._M_p,
                               (pSVar19->Type)._M_string_length);
          local_7a8[0] = (string)0x20;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_7a8,1);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(pSVar19->Name)._M_dataplus._M_p,
                               (pSVar19->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"[_NumInputPoints];\n",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_650 + 0x10),
                     "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n",0x34);
        }
        local_708.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (ShaderParameterInfo **)0x0;
        local_708.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ShaderParameterInfo **)0x0;
        local_708.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        local_6d8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_6e8 = (void *)0x0;
        iStack_6e0._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_7a8._0_8_ = pSVar19;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_708,(iterator)0x0,(ShaderParameterInfo **)local_7a8);
        local_7a8._0_8_ =
             (pSVar19->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_6e0._M_current == local_6d8) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_6e8,iStack_6e0,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7a8);
        }
        else {
          (iStack_6e0._M_current)->_M_current = (ShaderParameterInfo *)local_7a8._0_8_;
          iStack_6e0._M_current = iStack_6e0._M_current + 1;
        }
        if (((pSVar19->storageQualifier != Ret) && ((pSVar19->GSAttribs).PrimType == Undefined)) &&
           ((pSVar19->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_650 + 0x10),"    ",4)
          ;
          pcVar22 = (pSVar19->Type)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)local_650 + 0x10 +
                            (int)*(undefined8 *)(local_640[0]._M_allocated_capacity - 0x18));
          }
          else {
            sVar14 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_650 + 0x10),pcVar22,sVar14);
          }
          local_7a8[0] = (string)0x20;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_650 + 0x10),(char *)local_7a8,1);
          pcVar22 = (pSVar19->Name)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar22,sVar14);
          }
          if ((pSVar19->ArraySize)._M_string_length != 0) {
            local_7a8[0] = (string)0x5b;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_650 + 0x10),(char *)local_7a8,1);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(pSVar19->ArraySize)._M_dataplus._M_p,
                                 (pSVar19->ArraySize)._M_string_length);
            local_7a8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)local_7a8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_650 + 0x10),";\n",2);
        }
        if (local_708.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_708.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_6c0 = "";
          if (IVar3 == OutputPatch) {
            local_6c0 = "[i]";
          }
          local_6a0 = "";
          if (IVar3 == OutputPatch) {
            local_6a0 = "[]";
          }
          do {
            pSVar5 = local_708.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1];
            pSVar6 = (pSVar5->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar15 = (pSVar5->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pSVar6 == pSVar15) {
              if (iStack_6e0._M_current[-1]._M_current != pSVar6) {
                FormatString<char[26],char[49]>
                          ((string *)local_7a8,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                           (char (*) [49])pSVar6);
                DebugAssertionFailed
                          ((Char *)local_7a8._0_8_,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb19);
                if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
                  operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
                }
              }
              if ((pSVar5->Semantic)._M_string_length == 0) {
                LogError<true,char[36],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                           &pSVar5->Name,(char (*) [2])0x358930);
              }
              local_768 = aStack_760._M_local_buf + 8;
              aStack_760._M_allocated_capacity = 0;
              aStack_760._8_8_ = aStack_760._8_8_ & 0xffffffffffffff00;
              pHVar7 = local_6d0->m_Converter;
              HashMapStringKey::HashMapStringKey
                        ((HashMapStringKey *)local_7a8,(pSVar5->Semantic)._M_dataplus._M_p,false);
              pcVar22 = (char *)((local_7a8._8_8_ & 0x7fffffffffffffff) %
                                (pHVar7->m_HLSLSemanticToGLSLVar)._M_elems[4]._M_elems[0]._M_h.
                                _M_bucket_count);
              p_Var12 = std::
                        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((pHVar7->m_HLSLSemanticToGLSLVar)._M_elems + 4),
                                   (size_type)pcVar22,(key_type *)local_7a8,
                                   local_7a8._8_8_ & 0x7fffffffffffffff);
              if (p_Var12 == (__node_base_ptr)0x0) {
                p_Var18 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var18 = p_Var12->_M_nxt;
              }
              if (((pointer)local_7a8._0_8_ != (pointer)0x0) && ((long)local_7a8._8_8_ < 0)) {
                operator_delete__((void *)local_7a8._0_8_);
              }
              if (p_Var18 != (_Hash_node_base *)0x0) {
                pcVar22 = (char *)(p_Var18 + 3);
                std::__cxx11::string::_M_assign((string *)&local_768);
              }
              BuildParameterName_abi_cxx11_
                        ((string *)local_7a8,(ConversionStream *)pcVar22,&local_708,'.',"","",
                         local_6c0);
              if (IVar3 == OutputPatch) {
                pcVar22 = "    ";
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_650 + 0x10),"    ",4);
              }
              if ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)aStack_760._M_allocated_capacity ==
                  (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)0x0) {
                Prefix = "_";
                if (local_6d0->m_bUseInOutLocationQualifiers != false) {
                  Prefix = "_dsin_";
                }
                BuildParameterName_abi_cxx11_
                          (&local_748,(ConversionStream *)pcVar22,&local_708,'_',Prefix,"","");
                local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_728,local_748._M_dataplus._M_p,
                           local_748._M_dataplus._M_p + local_748._M_string_length);
                std::__cxx11::string::append((char *)&local_728);
                bVar4 = local_6d0->m_bUseInOutLocationQualifiers;
                iVar11 = -1;
                if (bVar4 != false) {
                  iVar11 = local_6c8;
                }
                pcVar22 = GetInterpolationQualifier(local_6d0,pSVar5);
                local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_788,local_748._M_dataplus._M_p,
                           local_748._M_dataplus._M_p + local_748._M_string_length);
                std::__cxx11::string::append((char *)&local_788);
                DefineInterfaceVar(iVar11,pcVar22,"in",&pSVar5->Type,&local_788,
                                   (stringstream *)local_340);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_788._M_dataplus._M_p != &local_788.field_2) {
                  operator_delete(local_788._M_dataplus._M_p,(ulong)(local_788.field_2._0_8_ + 1));
                }
                InitVariable((String *)local_7a8,&local_728,(stringstream *)local_650);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_728._M_dataplus._M_p != &local_728.field_2) {
                  operator_delete(local_728._M_dataplus._M_p,
                                  CONCAT71(local_728.field_2._1_7_,local_728.field_2._M_local_buf[0]
                                          ) + 1);
                }
                psVar23 = local_6a8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_748._M_dataplus._M_p != &local_748.field_2) {
                  operator_delete(local_748._M_dataplus._M_p,local_748.field_2._0_8_ + 1);
                }
                local_6c8 = local_6c8 + (uint)bVar4;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_650 + 0x10),"    ",4);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)(local_650 + 0x10),local_768,
                                     aStack_760._M_allocated_capacity);
                local_748._M_dataplus._M_p._0_1_ = 0x28;
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(char *)&local_748,1);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(char *)local_7a8._0_8_,local_7a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,");\n",3);
              }
              if ((pointer)local_7a8._0_8_ != (pointer)(local_7a8 + 0x10)) {
                operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
              }
              local_708.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_708.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iStack_6e0._M_current = iStack_6e0._M_current + -1;
              if (local_768 != aStack_760._M_local_buf + 8) {
                operator_delete(local_768,(ulong)(aStack_760._8_8_ + 1));
              }
            }
            else {
              if ((pSVar5->Semantic)._M_string_length != 0) {
                LogError<true,char[35],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name
                           ,(char (*) [2])0x358930);
                pSVar15 = (pSVar5->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pSVar6 = iStack_6e0._M_current[-1]._M_current;
              if (pSVar6 == pSVar15) {
                local_708.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_708.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
                iStack_6e0._M_current = iStack_6e0._M_current + -1;
              }
              else {
                iStack_6e0._M_current[-1]._M_current = pSVar6 + 1;
                if (local_708.
                    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_708.
                    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_7a8._0_8_ = pSVar6;
                  std::
                  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  ::
                  _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                            ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                              *)&local_708,
                             (iterator)
                             local_708.
                             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (ShaderParameterInfo **)local_7a8);
                }
                else {
                  *local_708.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
                  local_708.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_708.
                       super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_7a8._0_8_ =
                     (pSVar6->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (iStack_6e0._M_current == local_6d8) {
                  std::
                  vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  ::
                  _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                            ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                              *)&local_6e8,iStack_6e0,
                             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                              *)local_7a8);
                }
                else {
                  (iStack_6e0._M_current)->_M_current = (ShaderParameterInfo *)local_7a8._0_8_;
                  iStack_6e0._M_current = iStack_6e0._M_current + 1;
                }
              }
            }
          } while (local_708.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_708.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_6e8 != (void *)0x0) {
          operator_delete(local_6e8,(long)local_6d8 - (long)local_6e8);
        }
        if (local_708.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (ShaderParameterInfo **)0x0) {
          operator_delete(local_708.
                          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_708.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_708.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (IVar3 == OutputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_650 + 0x10),"    }\n",6);
        }
      }
      pSVar19 = pSVar19 + 1;
    } while (pSVar19 != local_698);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_6b0,(string *)local_7a8);
  pSVar19 = (pointer)(local_7a8 + 0x10);
  if ((pointer)local_7a8._0_8_ != pSVar19) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  ppSVar20 = (ShaderParameterInfo **)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    ppSVar20 = (ShaderParameterInfo **)
               CONCAT71(local_728.field_2._1_7_,local_728.field_2._M_local_buf[0]);
  }
  if (ppSVar20 < (ShaderParameterInfo **)(local_788._M_string_length + local_728._M_string_length))
  {
    uVar21 = (ShaderParameterInfo **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      uVar21 = local_788.field_2._0_8_;
    }
    if ((ulong)uVar21 <
        (ShaderParameterInfo **)(local_788._M_string_length + local_728._M_string_length))
    goto LAB_0020256a;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_788,0,(char *)0x0,(ulong)local_728._M_dataplus._M_p);
  }
  else {
LAB_0020256a:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_728,(ulong)local_788._M_dataplus._M_p);
  }
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 == paVar1) {
    local_748.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_748.field_2._8_8_ = puVar16[3];
  }
  else {
    local_748.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_748._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_748._M_string_length = puVar16[1];
  *puVar16 = paVar1;
  puVar16[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  uVar21 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
            *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    uVar21 = local_748.field_2._0_8_;
  }
  if ((ulong)uVar21 <
      (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
       *)(aStack_760._M_allocated_capacity + local_748._M_string_length)) {
    uVar21 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0xf;
    if (local_768 != aStack_760._M_local_buf + 8) {
      uVar21 = aStack_760._8_8_;
    }
    if ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
         *)(aStack_760._M_allocated_capacity + local_748._M_string_length) <= (ulong)uVar21) {
      plVar17 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_768,0,(char *)0x0,(ulong)local_748._M_dataplus._M_p
                                  );
      goto LAB_00202650;
    }
  }
  plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_748,(ulong)local_768);
LAB_00202650:
  pSVar6 = (pointer)(plVar17 + 2);
  if ((pointer)*plVar17 == pSVar6) {
    local_7a8[0x10] = pSVar6->storageQualifier;
    local_7a8[0x11] = pSVar6->interpolationQualifier;
    local_7a8[0x12] = (pSVar6->GSAttribs).PrimType;
    local_7a8[0x13] = (pSVar6->GSAttribs).Stream;
    local_7a8[0x14] = pSVar6->HSAttribs;
    local_7a8._21_3_ = *(undefined3 *)&pSVar6->field_0x5;
    local_7a8._24_8_ = plVar17[3];
    local_7a8._0_8_ = pSVar19;
  }
  else {
    local_7a8[0x10] = pSVar6->storageQualifier;
    local_7a8[0x11] = pSVar6->interpolationQualifier;
    local_7a8[0x12] = (pSVar6->GSAttribs).PrimType;
    local_7a8[0x13] = (pSVar6->GSAttribs).Stream;
    local_7a8[0x14] = pSVar6->HSAttribs;
    local_7a8._21_3_ = *(undefined3 *)&pSVar6->field_0x5;
    local_7a8._0_8_ = (pointer)*plVar17;
  }
  local_7a8._8_8_ = plVar17[1];
  *plVar17 = (long)pSVar6;
  plVar17[1] = 0;
  pSVar6->storageQualifier = Unknown;
  std::__cxx11::string::operator=((string *)local_6b8,(string *)local_7a8);
  if ((pointer)local_7a8._0_8_ != pSVar19) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  if (local_768 != aStack_760._M_local_buf + 8) {
    operator_delete(local_768,(ulong)(aStack_760._8_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,(ulong)(local_748.field_2._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,(ulong)(local_788.field_2._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,
                    CONCAT71(local_728.field_2._1_7_,local_728.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_650);
  std::ios_base::~ios_base(aiStack_5d0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_688);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments(TokenListType::iterator&          TypeToken,
                                                                            std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           Globals,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    auto Token = TypeToken;
    // [domain("quad")]
    // DSOut main( HS_CONSTANT_DATA_OUTPUT input,
    // ^

    std::unordered_map<HashMapStringKey, String> Attributes;
    ParseAttributesInComment(TypeToken->Delimiter, Attributes);
    ProcessShaderAttributes(Token, Attributes);

    stringstream GlobalsSS;
    auto         DomainIt = Attributes.find("domain");
    if (DomainIt == Attributes.end())
        LOG_ERROR_AND_THROW("Domain shader misses \"domain\" attribute");

    GlobalsSS << "layout(";
    if (DomainIt->second == "tri")
        GlobalsSS << "triangles";
    else if (DomainIt->second == "quad")
        GlobalsSS << "quads";
    else if (DomainIt->second == "isoline")
        GlobalsSS << "isolines";
    else
        LOG_ERROR_AND_THROW("Unexpected domain value \"", DomainIt->second, "\". String constant \"tri\", \"quad\" or \"isoline\" expected");

    auto PartitioningIt = Attributes.find("partitioning");
    if (PartitioningIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (PartitioningIt->second == "integer")
        GlobalsSS << ", equal_spacing";
    else if (PartitioningIt->second == "fractional_even")
        GlobalsSS << ", fractional_even_spacing";
    else if (PartitioningIt->second == "fractional_odd")
        GlobalsSS << ", fractional_odd_spacing";
    else if (PartitioningIt->second == "pow2")
    {
        LOG_WARNING_MESSAGE("pow2 partitioning is not supported by OpenGL. Using integer partitioning");
        GlobalsSS << ", equal_spacing";
    }
    else
        LOG_ERROR_AND_THROW("Unexpected partitioning \"", PartitioningIt->second, "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected");

    auto TopologyIt = Attributes.find("outputtopology");
    if (TopologyIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (TopologyIt->second == "point")
        GlobalsSS << "";
    else if (TopologyIt->second == "line")
        GlobalsSS << "";
    else if (TopologyIt->second == "triangle_cw")
        GlobalsSS << ", cw";
    else if (TopologyIt->second == "triangle_ccw")
        GlobalsSS << ", ccw";
    else
        LOG_ERROR_AND_THROW("Unexpected topology \"", TopologyIt->second, "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected");

    GlobalsSS << ")in;\n";

    std::stringstream PrologueSS, InterfaceVarsInSS, InterfaceVarsOutSS;
    int               inLocation = 0, outLocation = 0;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            bool IsPatch = TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::OutputPatch;
            if (IsPatch)
            {
                PrologueSS << "    const int _NumInputPoints = " << TopLevelParam.ArraySize << ";\n"; // gl_MaxPatchVertices
                PrologueSS << "    " << TopLevelParam.Type << ' ' << TopLevelParam.Name << "[_NumInputPoints];\n";
                // Iterate of the actual number of vertices in the input patch
                PrologueSS << "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n";
            }

            ProcessShaderArgument(
                TopLevelParam, DSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    // All inputs from vertex shaders to the TCS are aggregated into arrays, based on the size of the input patch.
                    // The size of these arrays is the number of input patches provided by the patch primitive.
                    // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Inputs
                    String FullIndexedParamName = BuildParameterName(MemberStack, '.', "", "", IsPatch ? "[i]" : "");
                    if (IsPatch)
                        PrologueSS << "    ";
                    if (Getter.empty())
                    {
                        auto VarName      = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsin_" : "_");
                        auto InputVarName = VarName + (IsPatch ? "[i]" : "");
                        // User-defined inputs can be declared as unbounded arrays
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? inLocation++ : -1,
                                           GetInterpolationQualifier(Param), "in",
                                           Param.Type, VarName + (IsPatch ? "[]" : ""), InterfaceVarsInSS);
                        InitVariable(FullIndexedParamName, InputVarName, PrologueSS);
                    }
                    else
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                } //
            );

            if (IsPatch)
            {
                PrologueSS << "    }\n";
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, DSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsout_" : "_");
                        // Per-vertex outputs are aggregated into arrays.
                        // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? outLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsOutSS);
                        // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                        // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                        ReturnHandlerSS << OutputVarName << " = " << SrcParamName << ";\\\n";
                    }
                    else
                        ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    Prologue = PrologueSS.str();
    Globals  = GlobalsSS.str() + InterfaceVarsInSS.str() + InterfaceVarsOutSS.str();
}